

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O2

SparseSupportVectors * __thiscall
CoreML::Specification::SupportVectorRegressor::mutable_sparsesupportvectors
          (SupportVectorRegressor *this)

{
  SparseSupportVectors *this_00;
  
  if (this->_oneof_case_[0] == 2) {
    this_00 = (this->supportVectors_).sparsesupportvectors_;
  }
  else {
    clear_supportVectors(this);
    this->_oneof_case_[0] = 2;
    this_00 = (SparseSupportVectors *)operator_new(0x30);
    SparseSupportVectors::SparseSupportVectors(this_00);
    (this->supportVectors_).sparsesupportvectors_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SparseSupportVectors* SupportVectorRegressor::mutable_sparsesupportvectors() {
  if (!has_sparsesupportvectors()) {
    clear_supportVectors();
    set_has_sparsesupportvectors();
    supportVectors_.sparsesupportvectors_ = new ::CoreML::Specification::SparseSupportVectors;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.SupportVectorRegressor.sparseSupportVectors)
  return supportVectors_.sparsesupportvectors_;
}